

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<const_kj::File,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskDirectory::createTemporary(DiskDirectory *this)

{
  Own<const_kj::File,_std::nullptr_t> OVar1;
  DiskDirectory *this_local;
  
  OVar1 = DiskHandle::createTemporary((DiskHandle *)this);
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<const File> createTemporary() const override {
    return DiskHandle::createTemporary();
  }